

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::(anonymous_namespace)::
sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
          (_anonymous_namespace_ *this,xpath_node *begin,xpath_node *end,
          document_order_comparator *pred)

{
  int *piVar1;
  int *piVar2;
  xml_attribute_struct *pxVar3;
  xml_node_struct *pxVar4;
  xml_attribute_struct *pxVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar9;
  xpath_node *extraout_RDX;
  xpath_node *pxVar11;
  xpath_node *extraout_RDX_00;
  xpath_node *extraout_RDX_01;
  xpath_node *extraout_RDX_02;
  xpath_node *extraout_RDX_03;
  xpath_node *rhs;
  xpath_node *extraout_RDX_04;
  xpath_node *extraout_RDX_05;
  xpath_node *extraout_RDX_06;
  xpath_node *this_00;
  long lVar12;
  ulong uVar13;
  xpath_node *lhs;
  xpath_node *pxVar14;
  undefined4 uVar15;
  xpath_node *unaff_R12;
  ulong uVar16;
  xpath_node *this_01;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  xpath_node val;
  xml_node_struct *local_58;
  xml_attribute_struct *pxStack_50;
  xpath_node *local_40;
  xpath_node *local_38;
  xpath_node *pxVar10;
  
  lVar12 = (long)begin - (long)this;
  do {
    if (lVar12 >> 4 < 0x21) {
      if (((xpath_node *)this != begin) &&
         (pxVar10 = (xpath_node *)((long)this + 0x10), pxVar10 != begin)) {
        lVar12 = 0;
        pxVar14 = pxVar10;
        do {
          local_58 = (pxVar14->_node)._root;
          pxStack_50 = (pxVar14->_attribute)._attr;
          bVar6 = anon_unknown_0::document_order_comparator::operator()
                            ((document_order_comparator *)&local_58,(xpath_node *)this,end);
          if (bVar6) {
            memmove(pxVar10,this,lVar12 * 0x10 + 0x10);
            end = extraout_RDX_04;
            pxVar11 = (xpath_node *)this;
          }
          else {
            bVar6 = anon_unknown_0::document_order_comparator::operator()
                              ((document_order_comparator *)&local_58,pxVar14 + -1,rhs);
            end = extraout_RDX_05;
            pxVar11 = pxVar14;
            while (bVar6 != false) {
              pxVar3 = pxVar11[-1]._attribute._attr;
              (pxVar11->_node)._root = pxVar11[-1]._node._root;
              (pxVar11->_attribute)._attr = pxVar3;
              bVar6 = anon_unknown_0::document_order_comparator::operator()
                                ((document_order_comparator *)&local_58,pxVar11 + -2,end);
              end = extraout_RDX_06;
              pxVar11 = pxVar11 + -1;
            }
          }
          (pxVar11->_node)._root = local_58;
          (pxVar11->_attribute)._attr = pxStack_50;
          pxVar14 = pxVar14 + 1;
          lVar12 = lVar12 + 1;
        } while (pxVar14 != begin);
      }
      return;
    }
    uVar13 = (ulong)(lVar12 >> 4) >> 1;
    pxVar11 = (xpath_node *)((long)this + uVar13 * 0x10);
    pxVar10 = begin + -1;
    lVar12 = (long)pxVar10 - (long)this >> 4;
    pxVar14 = (xpath_node *)this;
    local_38 = begin;
    if (0x28 < lVar12) {
      uVar16 = lVar12 + 1U >> 3;
      unaff_R12 = (xpath_node *)(uVar16 * 0x10);
      local_40 = (xpath_node *)((long)this + uVar16 * 0x10);
      median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                ((xpath_node *)this,local_40,(xpath_node *)((long)this + uVar16 * 2 * 0x10),pred);
      median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (pxVar11 + -uVar16,pxVar11,pxVar11 + uVar16,pred);
      median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (pxVar10 + uVar16 * -2,pxVar10 + -uVar16,pxVar10,pred);
      pxVar10 = pxVar10 + -uVar16;
      pxVar14 = local_40;
    }
    median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
              (pxVar14,pxVar11,pxVar10,pred);
    lVar12 = uVar13 * 0x10;
    do {
      lVar8 = lVar12;
      if (lVar8 == 0) break;
      piVar2 = (int *)((long)&(((xpath_node *)((long)this + -0x10))->_node)._root + lVar8);
      piVar1 = (int *)((long)&(((xpath_node *)this)->_node)._root + lVar8);
      auVar21._0_4_ = -(uint)(*piVar1 == *piVar2);
      auVar21._4_4_ = -(uint)(piVar1[1] == piVar2[1]);
      auVar21._8_4_ = -(uint)(piVar1[2] == piVar2[2]);
      auVar21._12_4_ = -(uint)(piVar1[3] == piVar2[3]);
      auVar17._4_4_ = auVar21._0_4_;
      auVar17._0_4_ = auVar21._4_4_;
      auVar17._8_4_ = auVar21._12_4_;
      auVar17._12_4_ = auVar21._8_4_;
      uVar9 = movmskpd((int)pred,auVar17 & auVar21);
      pred = (document_order_comparator *)(ulong)uVar9;
      lVar12 = lVar8 + -0x10;
    } while (uVar9 == 3);
    pxVar10 = (xpath_node *)((long)&(((xpath_node *)this)->_node)._root + lVar8);
    pxVar14 = (xpath_node *)((long)this + uVar13 * 0x10);
    do {
      lhs = pxVar14 + 1;
      pxVar11 = extraout_RDX;
      this_01 = pxVar10;
      this_00 = lhs;
      if (lhs == begin) break;
      auVar22._0_4_ = -(uint)(*(int *)&(pxVar10->_node)._root == *(int *)&(lhs->_node)._root);
      auVar22._4_4_ =
           -(uint)(*(int *)((long)&(pxVar10->_node)._root + 4) ==
                  *(int *)((long)&pxVar14[1]._node._root + 4));
      auVar22._8_4_ =
           -(uint)(*(int *)&(pxVar10->_attribute)._attr == *(int *)&pxVar14[1]._attribute._attr);
      auVar22._12_4_ =
           -(uint)(*(int *)((long)&(pxVar10->_attribute)._attr + 4) ==
                  *(int *)((long)&pxVar14[1]._attribute._attr + 4));
      auVar18._4_4_ = auVar22._0_4_;
      auVar18._0_4_ = auVar22._4_4_;
      auVar18._8_4_ = auVar22._12_4_;
      auVar18._12_4_ = auVar22._8_4_;
      uVar9 = movmskpd((int)pred,auVar18 & auVar22);
      pred = (document_order_comparator *)(ulong)uVar9;
      pxVar14 = lhs;
    } while (uVar9 == 3);
LAB_0011d2ea:
    uVar15 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
    for (; lhs != begin; lhs = lhs + 1) {
      bVar6 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)pxVar10,lhs,pxVar11);
      pxVar11 = extraout_RDX_00;
      if (!bVar6) {
        auVar23._0_4_ = -(uint)(*(int *)&(pxVar10->_node)._root == *(int *)&(lhs->_node)._root);
        auVar23._4_4_ =
             -(uint)(*(int *)((long)&(pxVar10->_node)._root + 4) ==
                    *(int *)((long)&(lhs->_node)._root + 4));
        auVar23._8_4_ =
             -(uint)(*(int *)&(pxVar10->_attribute)._attr == *(int *)&(lhs->_attribute)._attr);
        auVar23._12_4_ =
             -(uint)(*(int *)((long)&(pxVar10->_attribute)._attr + 4) ==
                    *(int *)((long)&(lhs->_attribute)._attr + 4));
        auVar19._4_4_ = auVar23._0_4_;
        auVar19._0_4_ = auVar23._4_4_;
        auVar19._8_4_ = auVar23._12_4_;
        auVar19._12_4_ = auVar23._8_4_;
        iVar7 = movmskpd((int)CONCAT71(extraout_var,bVar6),auVar19 & auVar23);
        if (iVar7 != 3) {
          uVar15 = 0;
          break;
        }
        local_58 = (lhs->_node)._root;
        pxStack_50 = (lhs->_attribute)._attr;
        pxVar3 = (this_00->_attribute)._attr;
        (lhs->_node)._root = (this_00->_node)._root;
        (lhs->_attribute)._attr = pxVar3;
        (this_00->_node)._root = local_58;
        (this_00->_attribute)._attr = pxStack_50;
        this_00 = this_00 + 1;
      }
    }
    local_40 = (xpath_node *)CONCAT44(local_40._4_4_,uVar15);
    unaff_R12 = pxVar10;
    while (pxVar14 = this_01, pxVar14 != (xpath_node *)this) {
      this_01 = pxVar14 + -1;
      bVar6 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)this_01,unaff_R12,pxVar11);
      pxVar11 = extraout_RDX_01;
      if (!bVar6) {
        auVar24._0_4_ =
             -(uint)(*(int *)&(this_01->_node)._root == *(int *)&(unaff_R12->_node)._root);
        auVar24._4_4_ =
             -(uint)(*(int *)((long)&pxVar14[-1]._node._root + 4) ==
                    *(int *)((long)&(unaff_R12->_node)._root + 4));
        auVar24._8_4_ =
             -(uint)(*(int *)&pxVar14[-1]._attribute._attr == *(int *)&(unaff_R12->_attribute)._attr
                    );
        auVar24._12_4_ =
             -(uint)(*(int *)((long)&pxVar14[-1]._attribute._attr + 4) ==
                    *(int *)((long)&(unaff_R12->_attribute)._attr + 4));
        auVar20._4_4_ = auVar24._0_4_;
        auVar20._0_4_ = auVar24._4_4_;
        auVar20._8_4_ = auVar24._12_4_;
        auVar20._12_4_ = auVar24._8_4_;
        iVar7 = movmskpd((int)CONCAT71(extraout_var_00,bVar6),auVar20 & auVar24);
        if (iVar7 != 3) {
          if ((char)local_40 == '\0') {
            local_58 = (lhs->_node)._root;
            pxStack_50 = (lhs->_attribute)._attr;
            pxVar3 = pxVar14[-1]._attribute._attr;
            (lhs->_node)._root = (this_01->_node)._root;
            (lhs->_attribute)._attr = pxVar3;
            lhs = lhs + 1;
            (this_01->_node)._root = local_58;
            pxVar14[-1]._attribute._attr = pxStack_50;
            pxVar10 = unaff_R12;
          }
          else {
            pxVar10 = unaff_R12 + -1;
            if (pxVar14 != unaff_R12) {
              pxVar4 = (this_01->_node)._root;
              pxVar3 = pxVar14[-1]._attribute._attr;
              pxVar5 = unaff_R12[-1]._attribute._attr;
              (this_01->_node)._root = (pxVar10->_node)._root;
              pxVar14[-1]._attribute._attr = pxVar5;
              (pxVar10->_node)._root = pxVar4;
              unaff_R12[-1]._attribute._attr = pxVar3;
            }
            local_58 = (pxVar10->_node)._root;
            pxStack_50 = unaff_R12[-1]._attribute._attr;
            pxVar3 = this_00[-1]._attribute._attr;
            (pxVar10->_node)._root = this_00[-1]._node._root;
            unaff_R12[-1]._attribute._attr = pxVar3;
            this_00[-1]._node._root = local_58;
            this_00[-1]._attribute._attr = pxStack_50;
            this_00 = this_00 + -1;
          }
          goto LAB_0011d2ea;
        }
        local_58 = (this_01->_node)._root;
        pxStack_50 = pxVar14[-1]._attribute._attr;
        pxVar3 = unaff_R12[-1]._attribute._attr;
        (this_01->_node)._root = unaff_R12[-1]._node._root;
        pxVar14[-1]._attribute._attr = pxVar3;
        unaff_R12[-1]._node._root = local_58;
        unaff_R12[-1]._attribute._attr = pxStack_50;
        unaff_R12 = unaff_R12 + -1;
      }
    }
    if ((char)local_40 == '\0') {
      if (this_00 != lhs) {
        pxVar4 = (unaff_R12->_node)._root;
        pxVar3 = (unaff_R12->_attribute)._attr;
        pxVar5 = (this_00->_attribute)._attr;
        (unaff_R12->_node)._root = (this_00->_node)._root;
        (unaff_R12->_attribute)._attr = pxVar5;
        (this_00->_node)._root = pxVar4;
        (this_00->_attribute)._attr = pxVar3;
      }
      local_58 = (lhs->_node)._root;
      pxStack_50 = (lhs->_attribute)._attr;
      pxVar3 = (unaff_R12->_attribute)._attr;
      (lhs->_node)._root = (unaff_R12->_node)._root;
      (lhs->_attribute)._attr = pxVar3;
      lhs = lhs + 1;
      (unaff_R12->_node)._root = local_58;
      (unaff_R12->_attribute)._attr = pxStack_50;
      pxVar10 = unaff_R12 + 1;
      this_01 = pxVar14;
      this_00 = this_00 + 1;
      goto LAB_0011d2ea;
    }
    pred = (document_order_comparator *)((long)local_38 - (long)this_00);
    if ((long)pred < (long)unaff_R12 - (long)this) {
      sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                ((_anonymous_namespace_ *)this_00,begin,pxVar11,pred);
      end = extraout_RDX_02;
      this_00 = (xpath_node *)this;
      begin = unaff_R12;
    }
    else {
      sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (this,unaff_R12,pxVar11,pred);
      end = extraout_RDX_03;
    }
    lVar12 = (long)begin - (long)this_00;
    this = (_anonymous_namespace_ *)this_00;
    unaff_R12 = begin;
  } while( true );
}

Assistant:

void sort(I begin, I end, const Pred& pred)
	{
		// sort large chunks
		while (end - begin > 32)
		{
			// find median element
			I middle = begin + (end - begin) / 2;
			median(begin, middle, end - 1, pred);

			// partition in three chunks (< = >)
			I eqbeg, eqend;
			partition(begin, middle, end, pred, &eqbeg, &eqend);

			// loop on larger half
			if (eqbeg - begin > end - eqend)
			{
				sort(eqend, end, pred);
				end = eqbeg;
			}
			else
			{
				sort(begin, eqbeg, pred);
				begin = eqend;
			}
		}

		// insertion sort small chunk
		if (begin != end) insertion_sort(begin, end, pred, &*begin);
	}